

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_newmember(HSQUIRRELVM v,SQInteger idx,SQBool bstatic)

{
  bool bVar1;
  SQObjectPtr *self;
  SQObjectPtr *key;
  SQObjectPtr *val;
  SQObjectPtr *attrs;
  char *err;
  
  if (idx < 0) {
    self = SQVM::GetUp(v,idx);
  }
  else {
    self = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  if ((self->super_SQObject)._type == OT_CLASS) {
    key = SQVM::GetUp(v,-3);
    if ((key->super_SQObject)._type != OT_NULL) {
      val = SQVM::GetUp(v,-2);
      attrs = SQVM::GetUp(v,-1);
      bVar1 = SQVM::NewSlotA(v,self,key,val,attrs,bstatic != 0,false);
      SQVM::Pop(v,3);
      return (ulong)bVar1 - 1;
    }
    err = "null key";
  }
  else {
    err = "new member only works with classes";
  }
  sq_throwerror(v,err);
  return -1;
}

Assistant:

SQRESULT sq_newmember(HSQUIRRELVM v,SQInteger idx,SQBool bstatic)
{
    SQObjectPtr &self = stack_get(v, idx);
    if(sq_type(self) != OT_CLASS) return sq_throwerror(v, _SC("new member only works with classes"));
    SQObjectPtr &key = v->GetUp(-3);
    if(sq_type(key) == OT_NULL) return sq_throwerror(v, _SC("null key"));
    if(!v->NewSlotA(self,key,v->GetUp(-2),v->GetUp(-1),bstatic?true:false,false)) {
        v->Pop(3);
        return SQ_ERROR;
    }
    v->Pop(3);
    return SQ_OK;
}